

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O0

void helicsFederateSetTimeRequestEntryCallback
               (HelicsFederate fed,
               _func_void_HelicsTime_HelicsTime_HelicsBool_void_ptr *requestTimeEntry,void *userdata
               ,HelicsError *err)

{
  Federate *pFVar1;
  Federate *in_RDX;
  function<void_(TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_bool)>
  *in_RSI;
  Federate *fedptr;
  function<void_(TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_bool)>
  *in_stack_ffffffffffffff60;
  HelicsError *in_stack_ffffffffffffff68;
  function<void_(TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_bool)>
  *in_stack_ffffffffffffff70;
  function<void_(TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_bool)>
  *in_stack_ffffffffffffff78;
  Federate *in_stack_ffffffffffffff80;
  
  pFVar1 = getFed(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  if (pFVar1 != (Federate *)0x0) {
    if (in_RSI == (function<void_(TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_bool)>
                   *)0x0) {
      std::
      function<void_(TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_bool)>
      ::function(in_stack_ffffffffffffff60);
      helics::Federate::setTimeRequestEntryCallback
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      std::
      function<void_(TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_bool)>
      ::~function((function<void_(TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_bool)>
                   *)0x1bcc96);
    }
    else {
      std::
      function<void(TimeRepresentation<count_time<9,long>>,TimeRepresentation<count_time<9,long>>,bool)>
      ::function<helicsFederateSetTimeRequestEntryCallback::__0,void>
                (in_stack_ffffffffffffff70,(anon_class_16_2_62f68478 *)in_stack_ffffffffffffff68);
      helics::Federate::setTimeRequestEntryCallback(in_RDX,in_RSI);
      std::
      function<void_(TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_bool)>
      ::~function((function<void_(TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_bool)>
                   *)0x1bcd09);
    }
  }
  return;
}

Assistant:

void helicsFederateSetTimeRequestEntryCallback(
    HelicsFederate fed,
    void (*requestTimeEntry)(HelicsTime currentTime, HelicsTime requestTime, HelicsBool iterating, void* userdata),
    void* userdata,
    HelicsError* err)
{
    auto* fedptr = getFed(fed, err);
    if (fedptr == nullptr) {
        return;
    }

    try {
        if (requestTimeEntry == nullptr) {
            fedptr->setTimeRequestEntryCallback({});
        } else {
            fedptr->setTimeRequestEntryCallback(
                [requestTimeEntry, userdata](helics::Time currentTime, helics::Time requestTime, bool iterating) {
                    requestTimeEntry(currentTime, requestTime, (iterating) ? HELICS_TRUE : HELICS_FALSE, userdata);
                });
        }
    }
    catch (...) {  // LCOV_EXCL_LINE
        helicsErrorHandler(err);  // LCOV_EXCL_LINE
    }
}